

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::ConvexH::ConvexH
          (ConvexH *this,int vertices_size,int edges_size,int facets_size)

{
  (this->vertices).element = (float3 *)0x0;
  (this->vertices).count = 0;
  (this->vertices).array_size = 0;
  if (vertices_size != 0) {
    Array<ConvexDecomposition::float3>::allocate(&this->vertices,vertices_size);
  }
  (this->edges).element = (HalfEdge *)0x0;
  (this->edges).count = 0;
  (this->edges).array_size = 0;
  if (edges_size != 0) {
    Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(&this->edges,edges_size);
  }
  (this->facets).element = (Plane *)0x0;
  (this->facets).count = 0;
  (this->facets).array_size = 0;
  if (facets_size != 0) {
    Array<ConvexDecomposition::Plane>::allocate(&this->facets,facets_size);
  }
  (this->vertices).count = vertices_size;
  (this->edges).count = edges_size;
  (this->facets).count = facets_size;
  return;
}

Assistant:

ConvexH::ConvexH(int vertices_size,int edges_size,int facets_size)
	:vertices(vertices_size)
	,edges(edges_size)
	,facets(facets_size)
{
	vertices.count=vertices_size;
	edges.count   = edges_size;
	facets.count  = facets_size;
}